

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::PlotShaded<unsigned_short>
               (char *label_id,unsigned_short *xs,unsigned_short *ys1,unsigned_short *ys2,int count,
               int offset,int stride)

{
  GetterXsYs<unsigned_short> getter2;
  GetterXsYs<unsigned_short> local_40;
  GetterXsYs<unsigned_short> local_20;
  
  if (count == 0) {
    local_40.Offset = 0;
  }
  else {
    local_40.Offset = (offset % count + count) % count;
  }
  local_40.Stride = stride;
  local_20.Stride = stride;
  local_40.Xs = xs;
  local_40.Ys = ys1;
  local_40.Count = count;
  local_20.Xs = xs;
  local_20.Ys = ys2;
  local_20.Count = count;
  local_20.Offset = local_40.Offset;
  PlotShadedEx<ImPlot::GetterXsYs<unsigned_short>,ImPlot::GetterXsYs<unsigned_short>>
            (label_id,&local_40,&local_20);
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys1, const T* ys2, int count, int offset, int stride) {
    GetterXsYs<T> getter1(xs, ys1, count, offset, stride);
    GetterXsYs<T> getter2(xs, ys2, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2);
}